

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall
cmMakefile::CompileFeatureKnown
          (cmMakefile *this,cmTarget *target,string *feature,string *lang,string *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmake *this_00;
  cmMakefile *pcVar3;
  string *this_01;
  size_type sVar4;
  char **ppcVar5;
  ostream *poVar6;
  string *psVar7;
  char *pcVar8;
  char *pcVar9;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_260;
  size_type local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_240;
  size_type local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  string local_220;
  cmMakefile *local_200;
  cmTarget *local_1f8;
  string *local_1f0;
  cmStrCmp local_1e8;
  cmStrCmp local_1c8;
  undefined1 local_1a8 [376];
  
  local_1f8 = target;
  local_1f0 = error;
  sVar4 = cmGeneratorExpression::Find(feature);
  if (sVar4 != 0xffffffffffffffff) {
    __assert_fail("cmGeneratorExpression::Find(feature) == std::string::npos",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmMakefile.cxx"
                  ,0x116a,
                  "bool cmMakefile::CompileFeatureKnown(const cmTarget *, const std::string &, std::string &, std::string *) const"
                 );
  }
  pcVar2 = (feature->_M_dataplus)._M_p;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_240,pcVar2,pcVar2 + feature->_M_string_length);
  paVar1 = &local_1c8.m_test.field_2;
  if (local_240 == &local_230) {
    local_1c8.m_test.field_2._8_8_ = local_230._8_8_;
    local_1c8.m_test._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1c8.m_test._M_dataplus._M_p = (pointer)local_240;
  }
  local_1c8.m_test.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_1c8.m_test.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_1c8.m_test._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_240 = &local_230;
  local_200 = this;
  ppcVar5 = std::find_if<char_const*const*,cmStrCmp>(C_FEATURES + 1,CXX_FEATURES,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_test._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8.m_test._M_dataplus._M_p,
                    local_1c8.m_test.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  if (ppcVar5 == CXX_FEATURES) {
    pcVar2 = (feature->_M_dataplus)._M_p;
    local_260 = &local_250;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar2,pcVar2 + feature->_M_string_length);
    paVar1 = &local_1e8.m_test.field_2;
    if (local_260 == &local_250) {
      local_1e8.m_test.field_2._8_8_ = local_250._8_8_;
      local_1e8.m_test._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1e8.m_test._M_dataplus._M_p = (pointer)local_260;
    }
    local_1e8.m_test.field_2._M_allocated_capacity._1_7_ = local_250._M_allocated_capacity._1_7_;
    local_1e8.m_test.field_2._M_local_buf[0] = local_250._M_local_buf[0];
    local_1e8.m_test._M_string_length = local_258;
    local_258 = 0;
    local_250._M_local_buf[0] = '\0';
    local_260 = &local_250;
    ppcVar5 = std::find_if<char_const*const*,cmStrCmp>
                        (CXX_FEATURES + 1,(char **)&DAT_00624a68,&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.m_test._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e8.m_test._M_dataplus._M_p,
                      local_1e8.m_test.field_2._M_allocated_capacity + 1);
    }
    if (local_260 != &local_250) {
      operator_delete(local_260,
                      CONCAT71(local_250._M_allocated_capacity._1_7_,local_250._M_local_buf[0]) + 1)
      ;
    }
    if (ppcVar5 == (char **)&DAT_00624a68) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      this_01 = local_1f0;
      pcVar9 = "specified";
      if (local_1f0 == (string *)0x0) {
        pcVar9 = "Specified";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8," unknown feature \"",0x12);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(feature->_M_dataplus)._M_p,feature->_M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" for target \"",0xe);
      psVar7 = cmTarget::GetName_abi_cxx11_(local_1f8);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\".",2);
      pcVar3 = local_200;
      if (this_01 == (string *)0x0) {
        this_00 = local_200->GlobalGenerator->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmake::IssueMessage(this_00,FATAL_ERROR,&local_220,&pcVar3->Backtrace);
      }
      else {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)this_01,(string *)&local_220);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      return false;
    }
    pcVar9 = (char *)lang->_M_string_length;
    pcVar8 = "CXX";
  }
  else {
    pcVar9 = (char *)lang->_M_string_length;
    pcVar8 = "C";
  }
  std::__cxx11::string::_M_replace((ulong)lang,0,pcVar9,(ulong)pcVar8);
  return true;
}

Assistant:

bool cmMakefile::CompileFeatureKnown(cmTarget const* target,
                                     const std::string& feature,
                                     std::string& lang,
                                     std::string* error) const
{
  assert(cmGeneratorExpression::Find(feature) == std::string::npos);

  bool isCFeature =
    std::find_if(cm::cbegin(C_FEATURES) + 1, cm::cend(C_FEATURES),
                 cmStrCmp(feature)) != cm::cend(C_FEATURES);
  if (isCFeature) {
    lang = "C";
    return true;
  }
  bool isCxxFeature =
    std::find_if(cm::cbegin(CXX_FEATURES) + 1, cm::cend(CXX_FEATURES),
                 cmStrCmp(feature)) != cm::cend(CXX_FEATURES);
  if (isCxxFeature) {
    lang = "CXX";
    return true;
  }
  std::ostringstream e;
  if (error) {
    e << "specified";
  } else {
    e << "Specified";
  }
  e << " unknown feature \"" << feature
    << "\" for "
       "target \""
    << target->GetName() << "\".";
  if (error) {
    *error = e.str();
  } else {
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                                           this->Backtrace);
  }
  return false;
}